

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleartext.c
# Opt level: O2

CURLcode Curl_auth_create_plain_message(char *authzid,char *authcid,char *passwd,bufref *out)

{
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  void *__dest;
  size_t len;
  long lVar1;
  CURLcode CVar2;
  
  if (authzid == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(authzid);
  }
  __n_00 = strlen(authcid);
  __n_01 = strlen(passwd);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (__n_01 < 0x7ffffffffffffffe && (__n | __n_00) >> 0x3e == 0) {
    lVar1 = __n_00 + __n;
    __dest = (*Curl_cmalloc)(__n_01 + lVar1 + 3);
    if (__dest != (void *)0x0) {
      len = __n_01 + lVar1 + 2;
      if (__n != 0) {
        memcpy(__dest,authzid,__n);
      }
      CVar2 = CURLE_OK;
      *(undefined1 *)((long)__dest + __n) = 0;
      memcpy((void *)((long)__dest + __n + 1),authcid,__n_00);
      *(undefined1 *)((long)__dest + lVar1 + 1) = 0;
      memcpy((void *)((long)__dest + __n_00 + __n + 2),passwd,__n_01);
      *(undefined1 *)((long)__dest + len) = 0;
      Curl_bufref_set(out,__dest,len,curl_free);
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_auth_create_plain_message(const char *authzid,
                                        const char *authcid,
                                        const char *passwd,
                                        struct bufref *out)
{
  char *plainauth;
  size_t plainlen;
  size_t zlen;
  size_t clen;
  size_t plen;

  zlen = (authzid == NULL ? 0 : strlen(authzid));
  clen = strlen(authcid);
  plen = strlen(passwd);

  /* Compute binary message length. Check for overflows. */
  if((zlen > SIZE_T_MAX/4) || (clen > SIZE_T_MAX/4) ||
     (plen > (SIZE_T_MAX/2 - 2)))
    return CURLE_OUT_OF_MEMORY;
  plainlen = zlen + clen + plen + 2;

  plainauth = malloc(plainlen + 1);
  if(!plainauth)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate the reply */
  if(zlen)
    memcpy(plainauth, authzid, zlen);
  plainauth[zlen] = '\0';
  memcpy(plainauth + zlen + 1, authcid, clen);
  plainauth[zlen + clen + 1] = '\0';
  memcpy(plainauth + zlen + clen + 2, passwd, plen);
  plainauth[plainlen] = '\0';
  Curl_bufref_set(out, plainauth, plainlen, curl_free);
  return CURLE_OK;
}